

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3cTestPackage.cpp
# Opt level: O3

int __thiscall es3cts::ES30TestPackage::init(ES30TestPackage *this,EVP_PKEY_CTX *ctx)

{
  PackageContext *pPVar1;
  int extraout_EAX;
  TestNode *node;
  
  deqp::TestPackage::init(&this->super_TestPackage,ctx);
  node = (TestNode *)operator_new(0x78);
  pPVar1 = (this->super_TestPackage).m_packageCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,(pPVar1->m_context).m_testCtx,"shaders","Shading Language Tests")
  ;
  node[1]._vptr_TestNode = (_func_int **)pPVar1;
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_020f2a20;
  tcu::TestNode::addChild((TestNode *)this,node);
  return extraout_EAX;
}

Assistant:

void ES30TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	deqp::TestPackage::init();

	try
	{
		addChild(new ShaderTests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		deqp::TestPackage::deinit();
		throw;
	}
}